

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void align_text_image_cb(Fl_Choice *i,void *v)

{
  uint uVar1;
  uint uVar2;
  Fl_Menu_Item *pFVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  Fl_Widget_Type *this;
  bool bVar7;
  Fl_Menu_Item *pFVar8;
  
  if ((char *)v == "LOAD") {
    iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar4 != 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
    pFVar8 = (i->super_Fl_Menu_).menu_;
    if (pFVar8->text != (char *)0x0) {
      uVar1 = (current_widget->o->label_).align_;
      do {
        if ((uVar1 & 800) == *(uint *)&pFVar8->user_data_) {
          Fl_Choice::value(i,pFVar8);
        }
        pFVar3 = pFVar8 + 1;
        pFVar8 = pFVar8 + 1;
      } while (pFVar3->text != (char *)0x0);
    }
  }
  else {
    pFVar8 = (i->super_Fl_Menu_).menu_;
    pFVar3 = (i->super_Fl_Menu_).value_;
    if (pFVar3 == (Fl_Menu_Item *)0x0) {
      lVar6 = -1;
    }
    else {
      lVar6 = (long)((int)((ulong)((long)pFVar3 - (long)pFVar8) >> 3) * -0x49249249);
    }
    if (Fl_Type::first != (Fl_Type *)0x0) {
      uVar1 = *(uint *)&pFVar8[lVar6].user_data_;
      bVar7 = true;
      this = (Fl_Widget_Type *)Fl_Type::first;
LAB_001854a8:
      do {
        if (((this->super_Fl_Type).selected != '\0') &&
           (iVar4 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this), iVar4 != 0)) {
          uVar2 = (this->o->label_).align_;
          uVar5 = uVar2 & 0xfffffcdf | uVar1;
          if (uVar2 != uVar5) {
            (this->o->label_).align_ = uVar5;
            Fl_Widget_Type::redraw(this);
            this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
            bVar7 = false;
            if (this == (Fl_Widget_Type *)0x0) goto LAB_00185500;
            goto LAB_001854a8;
          }
        }
        this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
        if (this == (Fl_Widget_Type *)0x0) {
          if (bVar7) {
            return;
          }
LAB_00185500:
          set_modflag(1);
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void align_text_image_cb(Fl_Choice *i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    Fl_Menu_Item *mi = (Fl_Menu_Item*)i->menu();
    Fl_Align b = current_widget->o->align() & FL_ALIGN_IMAGE_MASK;
    for (;mi->text;mi++) {
      if ((Fl_Align)(mi->argument())==b)
        i->value(mi);
    }
  } else {
    const Fl_Menu_Item *mi = i->menu() + i->value();
    Fl_Align b = Fl_Align(fl_uintptr_t(mi->user_data()));
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	Fl_Align x = q->o->align();
	Fl_Align y = (x & ~FL_ALIGN_IMAGE_MASK) | b;
	if (x != y) {
          q->o->align(y);
	  q->redraw();
	  mod = 1;
	}
      }
    }
    if (mod) set_modflag(1);
  }
}